

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_token_stream.c
# Opt level: O2

l2_token * l2_token_stream_next_token(l2_token_stream *token_stream_p)

{
  int lines;
  int cols;
  byte bVar1;
  char cVar2;
  int iVar3;
  l2_token *plVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  l2_parsing_error_type lVar9;
  l2_char_stream *char_stream_p;
  long lVar10;
  char seq [4];
  l2_token t;
  l2_string token_str_buff;
  
  l2_assert_func((long)token_stream_p,L2_INTERNAL_ERROR_NULL_POINTER,"l2_token_stream_next_token",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_token_stream.c"
                 ,0x35);
  iVar3 = token_stream_p->token_vector_current_pos;
  if ((ulong)(long)iVar3 < (token_stream_p->token_vector).size) {
    token_stream_p->token_vector_current_pos = iVar3 + 1;
    plVar4 = (l2_token *)l2_vector_at(&token_stream_p->token_vector,iVar3);
    return plVar4;
  }
  t.current_pos_at_stream = 0;
  t.current_line = 0;
  t.current_col = 0;
  t._44_4_ = 0;
  t.u.str.len = 0;
  t.u.str.max_len = 0;
  t.type = L2_TOKEN_TERMINATOR;
  t._4_4_ = 0;
  t.u.c_str = (char *)0x0;
  l2_string_create(&token_str_buff);
  iVar3 = 0;
switchD_00102639_caseD_9:
  bVar1 = l2_char_stream_next_char(token_stream_p->char_stream_p);
  char_stream_p = token_stream_p->char_stream_p;
  lines = char_stream_p->lines;
  cols = char_stream_p->cols;
  uVar8 = (ulong)bVar1;
  uVar6 = (uint)bVar1;
  switch(iVar3) {
  case 0:
    t.current_line = lines;
    t.current_pos_at_stream = char_stream_p->chars_vector_current_pos;
    t.current_col = cols;
    if ((0x19 < (byte)(bVar1 + 0xbf)) && (bVar1 != 0x5f && 0x19 < (byte)(bVar1 + 0x9f))) {
      if (bVar1 == 0x30) {
        t.type = L2_TOKEN_INTEGER_LITERAL;
        l2_string_push_char(&token_str_buff,'0');
        iVar3 = 2;
      }
      else {
        if (8 < (byte)(bVar1 - 0x31)) {
          iVar3 = 0;
          switch(bVar1) {
          case 9:
          case 10:
          case 0xd:
          case 0x20:
            goto switchD_00102639_caseD_9;
          case 0xb:
          case 0xc:
          case 0xe:
          case 0xf:
          case 0x10:
          case 0x11:
          case 0x12:
          case 0x13:
          case 0x14:
          case 0x15:
          case 0x16:
          case 0x17:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
          case 0x1c:
          case 0x1d:
          case 0x1e:
          case 0x1f:
          case 0x23:
          case 0x24:
          case 0x30:
          case 0x31:
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x35:
          case 0x36:
          case 0x37:
          case 0x38:
          case 0x39:
switchD_00102639_caseD_b:
            lVar9 = L2_PARSING_ERROR_ILLEGAL_CHARACTER;
            uVar8 = (ulong)(uint)(int)(char)bVar1;
            goto LAB_00102d7e;
          case 0x21:
            t.type = L2_TOKEN_LOGIC_NOT;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_NOT_EQUAL;
              goto LAB_0010295e;
            }
            break;
          case 0x22:
            t.type = L2_TOKEN_STRING_LITERAL;
            iVar3 = 5;
            goto switchD_00102639_caseD_9;
          case 0x25:
            t.type = L2_TOKEN_MOD;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_MOD_ASSIGN;
              goto LAB_0010295e;
            }
            break;
          case 0x26:
            t.type = L2_TOKEN_BIT_AND;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_BIT_AND_ASSIGN;
              goto LAB_0010295e;
            }
            if (cVar2 == '&') {
              t.type = L2_TOKEN_LOGIC_AND;
              goto LAB_0010295e;
            }
            break;
          case 0x27:
            t.type = L2_TOKEN_INTEGER_LITERAL;
            iVar3 = 4;
            goto switchD_00102639_caseD_9;
          case 0x28:
            t.type = L2_TOKEN_LP;
            goto LAB_0010295e;
          case 0x29:
            t.type = L2_TOKEN_RP;
            goto LAB_0010295e;
          case 0x2a:
            t.type = L2_TOKEN_MUL;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_MUL_ASSIGN;
              goto LAB_0010295e;
            }
            break;
          case 0x2b:
            t.type = L2_TOKEN_PLUS;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_PLUS_ASSIGN;
              goto LAB_0010295e;
            }
            if (cVar2 == '+') {
              t.type = L2_TOKEN_INC;
              goto LAB_0010295e;
            }
            break;
          case 0x2c:
            t.type = L2_TOKEN_COMMA;
            goto LAB_0010295e;
          case 0x2d:
            t.type = L2_TOKEN_SUB;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_SUB_ASSIGN;
              goto LAB_0010295e;
            }
            if (cVar2 == '-') {
              t.type = L2_TOKEN_DEC;
              goto LAB_0010295e;
            }
            break;
          case 0x2e:
            t.type = L2_TOKEN_DOT;
            goto LAB_0010295e;
          case 0x2f:
            t.type = L2_TOKEN_DIV;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_DIV_ASSIGN;
              goto LAB_0010295e;
            }
            if (cVar2 == '/') goto LAB_00102b96;
            break;
          case 0x3a:
            t.type = L2_TOKEN_COLON;
            goto LAB_0010295e;
          case 0x3b:
            t.type = L2_TOKEN_SEMICOLON;
            goto LAB_0010295e;
          case 0x3c:
            t.type = L2_TOKEN_LESS_THAN;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_LESS_EQUAL_THAN;
              goto LAB_0010295e;
            }
            if (cVar2 == '<') {
              t.type = L2_TOKEN_LSHIFT;
              cVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
              if (cVar2 == '=') {
                t.type = L2_TOKEN_LSHIFT_ASSIGN;
                goto LAB_0010295e;
              }
            }
            break;
          case 0x3d:
            t.type = L2_TOKEN_ASSIGN;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_EQUAL;
              goto LAB_0010295e;
            }
            break;
          case 0x3e:
            t.type = L2_TOKEN_GREAT_THAN;
            cVar2 = l2_char_stream_next_char(char_stream_p);
            if (cVar2 == '=') {
              t.type = L2_TOKEN_GREAT_EQUAL_THAN;
              goto LAB_0010295e;
            }
            if (cVar2 == '>') {
              t.type = L2_TOKEN_RSHIFT;
              cVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
              if (cVar2 == '=') {
                t.type = L2_TOKEN_RSHIFT_ASSIGN;
                goto LAB_0010295e;
              }
              if (cVar2 == '>') {
                t.type = L2_TOKEN_RSHIFT_UNSIGNED;
                cVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
                if (cVar2 == '=') {
                  t.type = L2_TOKEN_RSHIFT_UNSIGNED_ASSIGN;
                  goto LAB_0010295e;
                }
              }
            }
            break;
          case 0x3f:
            t.type = L2_TOKEN_QM;
            goto LAB_0010295e;
          default:
            switch(bVar1) {
            case 0x7b:
              t.type = L2_TOKEN_LBRACE;
              goto LAB_0010295e;
            case 0x7c:
              t.type = L2_TOKEN_BIT_OR;
              cVar2 = l2_char_stream_next_char(char_stream_p);
              if (cVar2 == '=') {
                t.type = L2_TOKEN_BIT_OR_ASSIGN;
                goto LAB_0010295e;
              }
              if (cVar2 == '|') {
                t.type = L2_TOKEN_LOGIC_OR;
                goto LAB_0010295e;
              }
              break;
            case 0x7d:
              t.type = L2_TOKEN_RBRACE;
              goto LAB_0010295e;
            case 0x7e:
              t.type = L2_TOKEN_BIT_NOT;
              goto LAB_0010295e;
            default:
              if (uVar6 == 0x5b) {
                t.type = L2_TOKEN_LBRACKET;
                goto LAB_0010295e;
              }
              if (uVar6 == 0x5d) {
                t.type = L2_TOKEN_RBRACKET;
                goto LAB_0010295e;
              }
              if (uVar6 != 0x5e) {
                if (uVar6 != 0xff) goto switchD_00102639_caseD_b;
                t.type = L2_TOKEN_TERMINATOR;
                goto LAB_0010295e;
              }
              t.type = L2_TOKEN_BIT_XOR;
              cVar2 = l2_char_stream_next_char(char_stream_p);
              if (cVar2 == '=') {
                t.type = L2_TOKEN_BIT_XOR_ASSIGN;
                goto LAB_0010295e;
              }
            }
          }
LAB_00102955:
          char_stream_p = token_stream_p->char_stream_p;
          goto LAB_00102959;
        }
        t.type = L2_TOKEN_INTEGER_LITERAL;
LAB_001022dc:
        l2_string_push_char(&token_str_buff,bVar1);
        iVar3 = 3;
      }
      goto switchD_00102639_caseD_9;
    }
    t.type = L2_TOKEN_IDENTIFIER;
    break;
  case 1:
    if ((((0x19 < (byte)(bVar1 + 0xbf)) && (9 < (byte)(bVar1 - 0x30))) && (bVar1 != 0x5f)) &&
       (0x19 < (byte)(bVar1 + 0x9f))) {
      l2_char_stream_rollback(char_stream_p);
      pcVar5 = l2_token_stream_str_keyword(&token_str_buff);
      if (pcVar5 == (char *)0x0) {
        t.type = L2_TOKEN_IDENTIFIER;
LAB_001029a3:
        l2_string_create(&t.u.str);
        l2_string_strcpy(&t.u.str,&token_str_buff);
      }
      else {
        t.type = L2_TOKEN_KEYWORD;
        t.u.c_str = pcVar5;
      }
      goto LAB_0010295e;
    }
    break;
  case 2:
    if ((bVar1 & 0xdf) == 0x58) {
      l2_string_push_char(&token_str_buff,bVar1);
      iVar3 = 0x20;
    }
    else {
      if (9 < (byte)(bVar1 - 0x30)) {
        if (bVar1 == 0x2e) goto LAB_001024b8;
        t.u.c_str = t.u.c_str & 0xffffffff00000000;
LAB_00102959:
        l2_char_stream_rollback(char_stream_p);
        goto LAB_0010295e;
      }
LAB_00102458:
      if (0x37 < bVar1) {
        lVar9 = L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL;
LAB_00102d7e:
        l2_parsing_error(lVar9,lines,cols,uVar8);
      }
      l2_string_push_char(&token_str_buff,bVar1);
      iVar3 = 0x21;
    }
    goto switchD_00102639_caseD_9;
  case 3:
    if ((byte)(bVar1 - 0x30) < 10) goto LAB_001022dc;
    if (bVar1 != 0x2e) {
      pcVar5 = l2_string_get_str_p(&token_str_buff);
      iVar3 = l2_cast_decimal_str_to_int(pcVar5);
LAB_00102951:
      t.u.integer = iVar3;
      goto LAB_00102955;
    }
LAB_001024b8:
    t.type = L2_TOKEN_REAL_LITERAL;
    l2_string_push_char(&token_str_buff,'.');
    iVar3 = 0x31;
    goto switchD_00102639_caseD_9;
  case 4:
    iVar3 = 0x40;
    if (bVar1 == 0x5c) goto switchD_00102639_caseD_9;
    if (uVar6 == 0xff) goto LAB_00102d99;
    if (uVar6 == 0x27) {
      lVar9 = L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL;
      goto LAB_00102d9b;
    }
    goto LAB_0010260e;
  case 5:
    iVar3 = 0x50;
    if (bVar1 != 0x5c) {
      if (uVar6 == 0x22) {
        l2_string_push_char(&token_str_buff,'\0');
        goto LAB_0010295e;
      }
LAB_00102365:
      if (uVar6 != 0xff) goto LAB_001025eb;
LAB_00102d85:
      lVar9 = L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL;
      goto LAB_00102d9b;
    }
    goto switchD_00102639_caseD_9;
  default:
    if (iVar3 == 0x20) {
      if ((9 < (byte)(bVar1 - 0x30)) &&
         ((0x25 < uVar6 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar6 - 0x41) & 0x3f) & 1) == 0)))) {
        lVar9 = L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL;
        goto LAB_00102d9b;
      }
LAB_001023e6:
      l2_string_push_char(&token_str_buff,bVar1);
      iVar3 = 0x200;
      goto switchD_00102639_caseD_9;
    }
    if (iVar3 == 0x21) {
      if (9 < (byte)(bVar1 - 0x30)) {
        pcVar5 = l2_string_get_str_p(&token_str_buff);
        iVar3 = l2_cast_octal_str_to_int(pcVar5 + 1);
        goto LAB_00102951;
      }
      goto LAB_00102458;
    }
    if (iVar3 == 0x31) {
      if (9 < (byte)(bVar1 - 0x30)) {
        lVar9 = L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL;
        goto LAB_00102d9b;
      }
LAB_00102386:
      l2_string_push_char(&token_str_buff,bVar1);
      iVar3 = 0x32;
      goto switchD_00102639_caseD_9;
    }
    if (iVar3 == 0x32) {
      if (9 < (byte)(bVar1 - 0x30)) {
        pcVar5 = l2_string_get_str_p(&token_str_buff);
        t.u.real = l2_cast_real_str_to_int(pcVar5);
        goto LAB_00102955;
      }
      goto LAB_00102386;
    }
    uVar7 = (uint)bVar1;
    if (iVar3 != 0x40) {
      if (iVar3 == 0x50) {
        switch(bVar1) {
        case 0x6e:
          bVar1 = 10;
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x75:
switchD_0010248a_caseD_6f:
          if ((bVar1 & 0xf8) == 0x30) {
            for (lVar10 = 1; lVar10 != 3; lVar10 = lVar10 + 1) {
              bVar1 = l2_char_stream_next_char(token_stream_p->char_stream_p);
              if ((bVar1 & 0xf8) != 0x30) {
                seq[lVar10] = '\0';
                l2_char_stream_rollback(token_stream_p->char_stream_p);
                goto LAB_001027db;
              }
              seq[lVar10] = bVar1;
            }
            lVar10 = 3;
LAB_001027db:
            seq[lVar10] = '\0';
            iVar3 = l2_cast_octal_str_to_int(seq);
            bVar1 = (byte)iVar3;
          }
          else if (bVar1 == 0x78) {
            seq[0] = l2_char_stream_next_char(char_stream_p);
            seq[1] = '\0';
            if ((9 < (byte)(seq[0] - 0x30U)) &&
               ((0x25 < (byte)seq[0] - 0x41 ||
                ((0x3f0000003fU >> ((ulong)((byte)seq[0] - 0x41) & 0x3f) & 1) == 0)))) {
              l2_char_stream_rollback(token_stream_p->char_stream_p);
              l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,lines,cols,seq);
              l2_string_push_char(&token_str_buff,seq[0]);
            }
            seq[1] = l2_char_stream_next_char(token_stream_p->char_stream_p);
            if (((byte)(seq[1] - 0x30U) < 10) ||
               (((byte)seq[1] - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)((byte)seq[1] - 0x41) & 0x3f) & 1) != 0)))) {
              seq[2] = '\0';
            }
            else {
              seq[1] = '\0';
              l2_char_stream_rollback(token_stream_p->char_stream_p);
            }
            iVar3 = l2_cast_hex_str_to_int(seq);
            bVar1 = (byte)iVar3;
          }
          else {
            if (uVar7 == 0xff) goto LAB_00102d85;
            seq[1] = '\0';
            seq[0] = bVar1;
            l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,lines,cols,seq);
          }
          break;
        case 0x72:
          bVar1 = 0xd;
          break;
        case 0x74:
          bVar1 = 9;
          break;
        case 0x76:
          bVar1 = 0xb;
          break;
        default:
          if (uVar7 == 0x22) {
            bVar1 = 0x22;
          }
          else if (uVar7 == 0x27) {
            bVar1 = 0x27;
          }
          else if (uVar7 == 0x3f) {
            bVar1 = 0x3f;
          }
          else if (uVar7 == 0x5c) {
            bVar1 = 0x5c;
          }
          else if (uVar6 == 0x66) {
            bVar1 = 0xc;
          }
          else if (uVar6 == 0x62) {
            bVar1 = 8;
          }
          else {
            if (uVar7 != 0x61) goto switchD_0010248a_caseD_6f;
            bVar1 = 7;
          }
        }
LAB_001025eb:
        l2_string_push_char(&token_str_buff,bVar1);
        iVar3 = 0x500;
      }
      else {
        if (iVar3 == 0x200) {
          if (((byte)(bVar1 - 0x30) < 10) ||
             ((uVar7 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(uVar7 - 0x41) & 0x3f) & 1) != 0)))
             ) goto LAB_001023e6;
          pcVar5 = l2_string_get_str_p(&token_str_buff);
          iVar3 = l2_cast_hex_str_to_int(pcVar5 + 2);
          goto LAB_00102951;
        }
        if (iVar3 != 0x500) goto code_r0x001021d2;
        iVar3 = 0x50;
        if (bVar1 != 0x5c) {
          if (uVar7 == 0x22) goto LAB_001029a3;
          goto LAB_00102365;
        }
      }
      goto switchD_00102639_caseD_9;
    }
    switch(bVar1) {
    case 0x6e:
      bVar1 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
switchD_001024a4_caseD_6f:
      if ((bVar1 & 0xf8) == 0x30) {
        for (lVar10 = 1; lVar10 != 3; lVar10 = lVar10 + 1) {
          bVar1 = l2_char_stream_next_char(token_stream_p->char_stream_p);
          if ((bVar1 & 0xf8) != 0x30) {
            seq[lVar10] = '\0';
            l2_char_stream_rollback(token_stream_p->char_stream_p);
            goto LAB_00102805;
          }
          seq[lVar10] = bVar1;
        }
        lVar10 = 3;
LAB_00102805:
        seq[lVar10] = '\0';
        iVar3 = l2_cast_octal_str_to_int(seq);
        bVar1 = (byte)iVar3;
      }
      else if (bVar1 == 0x78) {
        seq[0] = l2_char_stream_next_char(char_stream_p);
        seq[1] = '\0';
        if ((9 < (byte)(seq[0] - 0x30U)) &&
           ((0x25 < (byte)seq[0] - 0x41 ||
            ((0x3f0000003fU >> ((ulong)((byte)seq[0] - 0x41) & 0x3f) & 1) == 0)))) {
          l2_char_stream_rollback(token_stream_p->char_stream_p);
          l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,lines,cols,seq);
          l2_string_push_char(&token_str_buff,seq[0]);
        }
        seq[1] = l2_char_stream_next_char(token_stream_p->char_stream_p);
        if ((9 < (byte)(seq[1] - 0x30U)) &&
           ((0x25 < (byte)seq[1] - 0x41 ||
            ((0x3f0000003fU >> ((ulong)((byte)seq[1] - 0x41) & 0x3f) & 1) == 0)))) {
          seq[1] = '\0';
          l2_char_stream_rollback(token_stream_p->char_stream_p);
          iVar3 = 0x40;
          goto switchD_00102639_caseD_9;
        }
        seq[2] = '\0';
        iVar3 = l2_cast_hex_str_to_int(seq);
        bVar1 = (byte)iVar3;
      }
      else {
        if (uVar6 == 0xff) goto LAB_00102d99;
        seq[1] = '\0';
        seq[0] = bVar1;
        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,lines,cols,seq);
      }
      break;
    case 0x72:
      bVar1 = 0xd;
      break;
    case 0x74:
      bVar1 = 9;
      break;
    case 0x76:
      bVar1 = 0xb;
      break;
    default:
      if (uVar6 == 0x22) {
        bVar1 = 0x22;
      }
      else if (uVar6 == 0x27) {
        bVar1 = 0x27;
      }
      else if (uVar7 == 0x3f) {
        bVar1 = 0x3f;
      }
      else if (uVar7 == 0x5c) {
        bVar1 = 0x5c;
      }
      else if (uVar7 == 0x66) {
        bVar1 = 0xc;
      }
      else if (uVar7 == 0x62) {
        bVar1 = 8;
      }
      else {
        if (uVar6 != 0x61) goto switchD_001024a4_caseD_6f;
        bVar1 = 7;
      }
    }
LAB_0010260e:
    l2_string_push_char(&token_str_buff,bVar1);
    iVar3 = 0x400;
    goto switchD_00102639_caseD_9;
  }
  l2_string_push_char(&token_str_buff,bVar1);
  iVar3 = 1;
  goto switchD_00102639_caseD_9;
code_r0x001021d2:
  if (iVar3 == 0x400) goto LAB_001028b7;
  goto switchD_00102639_caseD_9;
LAB_001028b7:
  if (bVar1 != 0x27) {
    if (uVar6 == 0xff) {
LAB_00102d99:
      lVar9 = L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL;
    }
    else {
      lVar9 = L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL;
    }
LAB_00102d9b:
    l2_parsing_error(lVar9,lines,cols);
  }
  pcVar5 = l2_string_get_str_p(&token_str_buff);
  t.u.integer = (int)*pcVar5;
  goto LAB_0010295e;
  while (cVar2 != -1) {
LAB_00102b96:
    cVar2 = l2_char_stream_next_char(token_stream_p->char_stream_p);
    if (cVar2 == '\n') break;
  }
LAB_0010295e:
  l2_string_destroy(&token_str_buff);
  l2_vector_append(&token_stream_p->token_vector,&t);
  token_stream_p->token_vector_current_pos = token_stream_p->token_vector_current_pos + 1;
  plVar4 = (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
  return plVar4;
}

Assistant:

l2_token *l2_token_stream_next_token(l2_token_stream *token_stream_p) {
    l2_assert(token_stream_p, L2_INTERNAL_ERROR_NULL_POINTER);

    if (token_stream_p->token_vector_current_pos < token_stream_p->token_vector.size) {
        token_stream_p->token_vector_current_pos += 1;
        return (l2_token *)l2_vector_at(&token_stream_p->token_vector, token_stream_p->token_vector_current_pos - 1);
    }


    l2_token t = { 0 };
    int fa_state = 0x0;
    char ch = 0;
    l2_string token_str_buff;
    l2_string_create(&token_str_buff);

    while(1) {
        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);

        int lines = token_stream_p->char_stream_p->lines;
        int cols = token_stream_p->char_stream_p->cols;

        switch (fa_state) {
            case 0x0:
                t.current_col = cols;
                t.current_line = lines;
                t.current_pos_at_stream = token_stream_p->char_stream_p->chars_vector_current_pos;

                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_') {
                    t.type = L2_TOKEN_IDENTIFIER;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x1;

                } else if (ch == '0') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x2;

                } else if (ch >= '1' && ch <= '9') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x3;

                } else if (ch == '\'') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    fa_state = 0x4;

                } else if (ch == '\"') {
                    t.type = L2_TOKEN_STRING_LITERAL;
                    fa_state = 0x5;

                } else if (ch == '{') {
                    t.type = L2_TOKEN_LBRACE;
                    goto ret;

                } else if (ch == '}') {
                    t.type = L2_TOKEN_RBRACE;
                    goto ret;

                } else if (ch == '(') {
                    t.type = L2_TOKEN_LP;
                    goto ret;

                } else if (ch == ')') {
                    t.type = L2_TOKEN_RP;
                    goto ret;

                } else if (ch == '[') {
                    t.type = L2_TOKEN_LBRACKET;
                    goto ret;

                } else if (ch == ']') {
                    t.type = L2_TOKEN_RBRACKET;
                    goto ret;

                } else if (ch == '.') {
                    t.type = L2_TOKEN_DOT;
                    goto ret;

                } else if (ch == '!') {
                    t.type = L2_TOKEN_LOGIC_NOT;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_NOT_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '~') {
                    t.type = L2_TOKEN_BIT_NOT;
                    goto ret;

                } else if (ch == '*') {
                    t.type = L2_TOKEN_MUL;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MUL_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '/') {
                    t.type = L2_TOKEN_DIV;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_DIV_ASSIGN;
                    } else if (ch == '/') {
						do {
							ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
						} while (ch != '\n' && ch != EOF);
		    		} else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '%') {
                    t.type = L2_TOKEN_MOD;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MOD_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '+') {
                    t.type = L2_TOKEN_PLUS;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '+') {
                        t.type = L2_TOKEN_INC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_PLUS_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '-') {
                    t.type = L2_TOKEN_SUB;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '-') {
                        t.type = L2_TOKEN_DEC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_SUB_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '>') {
                    t.type = L2_TOKEN_GREAT_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '>') {
                        t.type = L2_TOKEN_RSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '>') {
                            t.type = L2_TOKEN_RSHIFT_UNSIGNED;
                            ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                            if (ch == '=') {
                                t.type = L2_TOKEN_RSHIFT_UNSIGNED_ASSIGN;
                            } else {
                                l2_char_stream_rollback(token_stream_p->char_stream_p);
                            }
                        } else if (ch == '=') {
                            t.type = L2_TOKEN_RSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_GREAT_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '<') {
                    t.type = L2_TOKEN_LESS_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '<') {
                        t.type = L2_TOKEN_LSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '=') {
                            t.type = L2_TOKEN_LSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_LESS_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '=') {
                    t.type = L2_TOKEN_ASSIGN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '&') {
                    t.type = L2_TOKEN_BIT_AND;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '&') {
                        t.type = L2_TOKEN_LOGIC_AND;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_AND_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '^') {
                    t.type = L2_TOKEN_BIT_XOR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_BIT_XOR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '|') {
                    t.type = L2_TOKEN_BIT_OR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '|') {
                        t.type = L2_TOKEN_LOGIC_OR;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_OR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '?') {
                    t.type = L2_TOKEN_QM;
                    goto ret;

                } else if (ch == ':') {
                    t.type = L2_TOKEN_COLON;
                    goto ret;

                } else if (ch == ',') {
                    t.type = L2_TOKEN_COMMA;
                    goto ret;

                } else if (ch == ';') {
                    t.type = L2_TOKEN_SEMICOLON;
                    goto ret;

                } else if (l2_char_is_blank(ch)) {

                } else if (ch == L2_EOF) {
                    t.type = L2_TOKEN_TERMINATOR;
                    goto ret;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_CHARACTER, lines, cols, ch);

                }

                break;

            case 0x1: /* handle identifier or keyword */
                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_' || (ch >= '0' && ch <= '9')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    char *keyword_p = l2_token_stream_str_keyword(&token_str_buff);
                    if (keyword_p) {
                        t.type = L2_TOKEN_KEYWORD;
                        //l2_string_destroy(&token_str_buff);
                        t.u.c_str = keyword_p;
                    } else {
                        t.type = L2_TOKEN_IDENTIFIER;
                        l2_string_create(&t.u.str);
                        l2_string_strcpy(&t.u.str, &token_str_buff);
                    }
                    goto ret;

                }
                break;

            case 0x2: /* handle oct and hex number literal ( begin with 0 ) */
                if (ch == 'X' || ch == 'x') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x20;

                } else if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x21;

				} else if (ch == '.') {
					t.type = L2_TOKEN_REAL_LITERAL;
					l2_string_push_char(&token_str_buff, ch);
					fa_state = 0x31;

				} else { /* get 0 */
                    t.u.integer = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x20: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x200;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL, lines, cols);

                }
                break;

            case 0x200: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_hex_str_to_int(&(l2_string_get_str_p(&token_str_buff)[2]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x21: /* handle oct number literal */
                if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_octal_str_to_int(&(l2_string_get_str_p(&token_str_buff)[1]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x3: /* handle dec number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);

                } else if (ch == '.') {
                    t.type = L2_TOKEN_REAL_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x31;

                } else {
                    t.u.integer = l2_cast_decimal_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x31: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL, lines, cols);
                }
                break;

            case 0x32: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    t.u.real = l2_cast_real_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x4: /* handle character literal */
                if (ch == '\'') {
                    l2_parsing_error(L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL, lines, cols);

                } else if (ch == '\\') {
                    fa_state = 0x40;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x400;

                }
                break;

            case 0x40: /* handle escape character */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x400;

                break;

            case 0x400:
                if (ch == '\'') {
                    t.u.integer = l2_string_get_str_p(&token_str_buff)[0];
                    goto ret;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL, lines, cols);

                }
                break;

            case 0x5: /* handle string literal */
                if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\0');
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x500;
                }
                break;

            case 0x50: /* handle escape character in string literal */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                        fa_state = 0x500;
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x500;
                break;

            case 0x500:
                if (ch == '\"') {
                    l2_string_create(&t.u.str);
                    l2_string_strcpy(&t.u.str, &token_str_buff);
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                }
                break;
        }


    }

    ret:

    l2_string_destroy(&token_str_buff);

    l2_vector_append(&token_stream_p->token_vector, &t);
    token_stream_p->token_vector_current_pos += 1;
    return (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
}